

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_whitelist_sign
              (secp256k1_context *ctx,secp256k1_whitelist_signature *sig,
              secp256k1_pubkey *online_pubkeys,secp256k1_pubkey *offline_pubkeys,size_t n_keys,
              secp256k1_pubkey *sub_pubkey,uchar *online_seckey,uchar *summed_seckey,size_t index)

{
  bool bVar1;
  int iVar2;
  uchar local_a068 [4];
  int done;
  uchar nonce32 [32];
  size_t i;
  int overflow;
  uint count;
  uchar seckey32 [32];
  int local_a00c;
  byte local_a008;
  byte local_a007;
  int ret;
  uchar msg32 [32];
  secp256k1_scalar non;
  secp256k1_scalar sec;
  secp256k1_scalar s [255];
  secp256k1_gej pubs [255];
  secp256k1_pubkey *sub_pubkey_local;
  size_t n_keys_local;
  secp256k1_pubkey *offline_pubkeys_local;
  secp256k1_pubkey *online_pubkeys_local;
  secp256k1_whitelist_signature *sig_local;
  secp256k1_context *ctx_local;
  
  sub_pubkey_local = (secp256k1_pubkey *)n_keys;
  n_keys_local = (size_t)offline_pubkeys;
  offline_pubkeys_local = online_pubkeys;
  online_pubkeys_local = (secp256k1_pubkey *)sig;
  sig_local = (secp256k1_whitelist_signature *)ctx;
  iVar2 = secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx);
  if (iVar2 == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)(sig_local->data + 0xa0),
               "secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx)");
    ctx_local._4_4_ = 0;
  }
  else if (online_pubkeys_local == (secp256k1_pubkey *)0x0) {
    secp256k1_callback_call((secp256k1_callback *)(sig_local->data + 0xa0),"sig != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (offline_pubkeys_local == (secp256k1_pubkey *)0x0) {
    secp256k1_callback_call((secp256k1_callback *)(sig_local->data + 0xa0),"online_pubkeys != NULL")
    ;
    ctx_local._4_4_ = 0;
  }
  else if (n_keys_local == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)(sig_local->data + 0xa0),"offline_pubkeys != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (sub_pubkey_local < (secp256k1_pubkey *)0x100) {
    if (sub_pubkey == (secp256k1_pubkey *)0x0) {
      secp256k1_callback_call((secp256k1_callback *)(sig_local->data + 0xa0),"sub_pubkey != NULL");
      ctx_local._4_4_ = 0;
    }
    else if (online_seckey == (uchar *)0x0) {
      secp256k1_callback_call
                ((secp256k1_callback *)(sig_local->data + 0xa0),"online_seckey != NULL");
      ctx_local._4_4_ = 0;
    }
    else if (summed_seckey == (uchar *)0x0) {
      secp256k1_callback_call
                ((secp256k1_callback *)(sig_local->data + 0xa0),"summed_seckey != NULL");
      ctx_local._4_4_ = 0;
    }
    else if (index < sub_pubkey_local) {
      local_a00c = secp256k1_whitelist_compute_keys_and_message
                             ((secp256k1_context *)sig_local,&local_a008,
                              (secp256k1_gej *)(s[0xfe].d + 3),offline_pubkeys_local,
                              (secp256k1_pubkey *)n_keys_local,(int)sub_pubkey_local,sub_pubkey);
      if (local_a00c != 0) {
        local_a00c = secp256k1_whitelist_compute_tweaked_privkey
                               ((secp256k1_context *)sig_local,(secp256k1_scalar *)(non.d + 3),
                                online_seckey,summed_seckey);
      }
      if (local_a00c != 0) {
        i._4_4_ = 0;
        i._0_4_ = 0;
        secp256k1_scalar_get_b32((uchar *)&overflow,(secp256k1_scalar *)(non.d + 3));
        do {
          while( true ) {
            local_a00c = nonce_function_rfc6979
                                   (local_a068,&local_a008,(uchar *)&overflow,(uchar *)0x0,
                                    (void *)0x0,i._4_4_);
            if (local_a00c == 0) goto LAB_0012bec2;
            secp256k1_scalar_set_b32((secp256k1_scalar *)(msg32 + 0x18),local_a068,(int *)&i);
            memset(local_a068,0,0x20);
            if (((int)i == 0) &&
               (iVar2 = secp256k1_scalar_is_zero((secp256k1_scalar *)(msg32 + 0x18)), iVar2 == 0))
            break;
            i._4_4_ = i._4_4_ + 1;
          }
          bVar1 = true;
          nonce32[0x18] = '\0';
          nonce32[0x19] = '\0';
          nonce32[0x1a] = '\0';
          nonce32[0x1b] = '\0';
          nonce32[0x1c] = '\0';
          nonce32[0x1d] = '\0';
          nonce32[0x1e] = '\0';
          nonce32[0x1f] = '\0';
          for (; (ulong)nonce32._24_8_ < sub_pubkey_local; nonce32._24_8_ = nonce32._24_8_ + 1) {
            local_a008 = local_a008 ^ (uchar)nonce32._24_8_ + 1;
            local_a007 = local_a007 ^ (byte)((ulong)(nonce32._24_8_ + 1) >> 8);
            local_a00c = nonce_function_rfc6979
                                   (online_pubkeys_local->data + nonce32._24_8_ * 0x20 + 0x28,
                                    &local_a008,(uchar *)&overflow,(uchar *)0x0,(void *)0x0,i._4_4_)
            ;
            if (local_a00c == 0) break;
            secp256k1_scalar_set_b32
                      ((secp256k1_scalar *)(s[nonce32._24_8_ + -1].d + 3),
                       online_pubkeys_local->data + nonce32._24_8_ * 0x20 + 0x28,(int *)&i);
            local_a008 = local_a008 ^ (uchar)nonce32._24_8_ + 1;
            local_a007 = local_a007 ^ (byte)((ulong)(nonce32._24_8_ + 1) >> 8);
            if (((int)i != 0) ||
               (iVar2 = secp256k1_scalar_is_zero((secp256k1_scalar *)(s[nonce32._24_8_ + -1].d + 3))
               , iVar2 != 0)) {
              i._4_4_ = i._4_4_ + 1;
              bVar1 = false;
              break;
            }
          }
        } while (!bVar1);
LAB_0012bec2:
        memset(&overflow,0,0x20);
      }
      if (local_a00c != 0) {
        *(secp256k1_pubkey **)online_pubkeys_local->data = sub_pubkey_local;
        local_a00c = secp256k1_borromean_sign
                               ((secp256k1_ecmult_gen_context *)sig_local,
                                online_pubkeys_local->data + 8,(secp256k1_scalar *)(sec.d + 3),
                                (secp256k1_gej *)(s[0xfe].d + 3),(secp256k1_scalar *)(msg32 + 0x18),
                                (secp256k1_scalar *)(non.d + 3),(size_t *)&sub_pubkey_local,&index,1
                                ,&local_a008,0x20);
        secp256k1_scalar_get_b32
                  (online_pubkeys_local->data + index * 0x20 + 0x28,
                   (secp256k1_scalar *)(s[index - 1].d + 3));
      }
      secp256k1_scalar_clear((secp256k1_scalar *)(msg32 + 0x18));
      secp256k1_scalar_clear((secp256k1_scalar *)(non.d + 3));
      ctx_local._4_4_ = local_a00c;
    }
    else {
      secp256k1_callback_call((secp256k1_callback *)(sig_local->data + 0xa0),"index < n_keys");
      ctx_local._4_4_ = 0;
    }
  }
  else {
    secp256k1_callback_call((secp256k1_callback *)(sig_local->data + 0xa0),"n_keys <= MAX_KEYS");
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_whitelist_sign(const secp256k1_context* ctx, secp256k1_whitelist_signature *sig, const secp256k1_pubkey *online_pubkeys, const secp256k1_pubkey *offline_pubkeys, const size_t n_keys, const secp256k1_pubkey *sub_pubkey, const unsigned char *online_seckey, const unsigned char *summed_seckey, const size_t index) {
    secp256k1_gej pubs[MAX_KEYS];
    secp256k1_scalar s[MAX_KEYS];
    secp256k1_scalar sec, non;
    unsigned char msg32[32];
    int ret;

    /* Sanity checks */
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(sig != NULL);
    ARG_CHECK(online_pubkeys != NULL);
    ARG_CHECK(offline_pubkeys != NULL);
    ARG_CHECK(n_keys <= MAX_KEYS);
    ARG_CHECK(sub_pubkey != NULL);
    ARG_CHECK(online_seckey != NULL);
    ARG_CHECK(summed_seckey != NULL);
    ARG_CHECK(index < n_keys);

    /* Compute pubkeys: online_pubkey + tweaked(offline_pubkey + address), and message */
    ret = secp256k1_whitelist_compute_keys_and_message(ctx, msg32, pubs, online_pubkeys, offline_pubkeys, n_keys, sub_pubkey);

    /* Compute signing key: online_seckey + tweaked(summed_seckey) */
    if (ret) {
        ret = secp256k1_whitelist_compute_tweaked_privkey(ctx, &sec, online_seckey, summed_seckey);
    }
    /* Compute nonce and random s-values */
    if (ret) {
        unsigned char seckey32[32];
        unsigned int count = 0;
        int overflow = 0;

        secp256k1_scalar_get_b32(seckey32, &sec);
        while (1) {
            size_t i;
            unsigned char nonce32[32];
            int done;
            ret = secp256k1_nonce_function_default(nonce32, msg32, seckey32, NULL, NULL, count);
            if (!ret) {
                break;
            }
            secp256k1_scalar_set_b32(&non, nonce32, &overflow);
            memset(nonce32, 0, 32);
            if (overflow || secp256k1_scalar_is_zero(&non)) {
                count++;
                continue;
            }
            done = 1;
            for (i = 0; i < n_keys; i++) {
                msg32[0] ^= i + 1;
                msg32[1] ^= (i + 1) / 0x100;
                ret = secp256k1_nonce_function_default(&sig->data[32 * (i + 1)], msg32, seckey32, NULL, NULL, count);
                if (!ret) {
                    break;
                }
                secp256k1_scalar_set_b32(&s[i], &sig->data[32 * (i + 1)], &overflow);
                msg32[0] ^= i + 1;
                msg32[1] ^= (i + 1) / 0x100;
                if (overflow || secp256k1_scalar_is_zero(&s[i])) {
                    count++;
                    done = 0;
                    break;
                }
            }
            if (done) {
                break;
            }
        }
        memset(seckey32, 0, 32);
    }
    /* Actually sign */
    if (ret) {
        sig->n_keys = n_keys;
        ret = secp256k1_borromean_sign(&ctx->ecmult_gen_ctx, &sig->data[0], s, pubs, &non, &sec, &n_keys, &index, 1, msg32, 32);
        /* Signing will change s[index], so update in the sig structure */
        secp256k1_scalar_get_b32(&sig->data[32 * (index + 1)], &s[index]);
    }

    secp256k1_scalar_clear(&non);
    secp256k1_scalar_clear(&sec);
    return ret;
}